

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcp_connection.cpp
# Opt level: O1

bool __thiscall cube::net::TcpConnection::Write(TcpConnection *this,char *data,size_t len)

{
  bool bVar1;
  _Any_data local_38;
  code *local_28;
  undefined8 uStack_20;
  
  local_28 = (code *)0x0;
  uStack_20 = 0;
  local_38._M_unused._M_object = (void *)0x0;
  local_38._8_8_ = 0;
  bVar1 = Write(this,data,len,(WriteCompleteCallback *)&local_38);
  if (local_28 != (code *)0x0) {
    (*local_28)(&local_38,&local_38,__destroy_functor);
  }
  return bVar1;
}

Assistant:

bool TcpConnection::Write(const char *data, size_t len) {
    return Write(data, len, NULL);
}